

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_ext(DisasContext_conflict1 *s,uint32_t insn)

{
  int pos;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  uint destidx;
  TCGv_i64 tcg_dest;
  TCGv_i64 tcg_dest_00;
  TCGv_i64 tcg_dest_01;
  uint srcidx;
  uint uVar2;
  uintptr_t o_2;
  uint srcidx_00;
  uintptr_t o;
  bool bVar3;
  
  if (((insn & 0xc00000) == 0) && ((insn & 0x40004000) != 0x4000)) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var1 = fp_access_check(s);
    if (_Var1) {
      uVar2 = insn >> 0xb & 0xf;
      srcidx = insn >> 0x10 & 0x1f;
      srcidx_00 = insn >> 5 & 0x1f;
      destidx = insn & 0x1f;
      pos = uVar2 * 8;
      tcg_dest = tcg_temp_new_i64(tcg_ctx);
      tcg_dest_00 = tcg_temp_new_i64(tcg_ctx);
      if ((insn >> 0x1e & 1) == 0) {
        read_vec_element(s,tcg_dest_00,srcidx_00,0,MO_64);
        if (uVar2 != 0) {
          read_vec_element(s,tcg_dest,srcidx,0,MO_64);
          do_ext64(s,tcg_dest,tcg_dest_00,pos);
        }
        tcg_gen_movi_i64_aarch64(tcg_ctx,tcg_dest,0);
      }
      else {
        bVar3 = uVar2 < 8;
        uVar2 = srcidx_00;
        if (!bVar3) {
          uVar2 = srcidx;
          pos = pos + -0x40;
        }
        read_vec_element(s,tcg_dest_00,srcidx_00,(uint)!bVar3,MO_64);
        read_vec_element(s,tcg_dest,uVar2,(uint)bVar3,MO_64);
        if (pos != 0) {
          do_ext64(s,tcg_dest,tcg_dest_00,pos);
          tcg_dest_01 = tcg_temp_new_i64(tcg_ctx);
          read_vec_element(s,tcg_dest_01,srcidx,(uint)!bVar3,MO_64);
          do_ext64(s,tcg_dest_01,tcg_dest,pos);
          tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest_01 + (long)tcg_ctx));
        }
      }
      write_vec_element(s,tcg_dest_00,destidx,0,MO_64);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest_00 + (long)tcg_ctx));
      write_vec_element(s,tcg_dest,destidx,1,MO_64);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
      clear_vec_high(s,true,destidx);
      return;
    }
    return;
  }
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_simd_ext(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int is_q = extract32(insn, 30, 1);
    int op2 = extract32(insn, 22, 2);
    int imm4 = extract32(insn, 11, 4);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    int pos = imm4 << 3;
    TCGv_i64 tcg_resl, tcg_resh;

    if (op2 != 0 || (!is_q && extract32(imm4, 3, 1))) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_resh = tcg_temp_new_i64(tcg_ctx);
    tcg_resl = tcg_temp_new_i64(tcg_ctx);

    /* Vd gets bits starting at pos bits into Vm:Vn. This is
     * either extracting 128 bits from a 128:128 concatenation, or
     * extracting 64 bits from a 64:64 concatenation.
     */
    if (!is_q) {
        read_vec_element(s, tcg_resl, rn, 0, MO_64);
        if (pos != 0) {
            read_vec_element(s, tcg_resh, rm, 0, MO_64);
            do_ext64(s, tcg_resh, tcg_resl, pos);
        }
        tcg_gen_movi_i64(tcg_ctx, tcg_resh, 0);
    } else {
        TCGv_i64 tcg_hh;
        typedef struct {
            int reg;
            int elt;
        } EltPosns;
        EltPosns eltposns[] = { {rn, 0}, {rn, 1}, {rm, 0}, {rm, 1} };
        EltPosns *elt = eltposns;

        if (pos >= 64) {
            elt++;
            pos -= 64;
        }

        read_vec_element(s, tcg_resl, elt->reg, elt->elt, MO_64);
        elt++;
        read_vec_element(s, tcg_resh, elt->reg, elt->elt, MO_64);
        elt++;
        if (pos != 0) {
            do_ext64(s, tcg_resh, tcg_resl, pos);
            tcg_hh = tcg_temp_new_i64(tcg_ctx);
            read_vec_element(s, tcg_hh, elt->reg, elt->elt, MO_64);
            do_ext64(s, tcg_hh, tcg_resh, pos);
            tcg_temp_free_i64(tcg_ctx, tcg_hh);
        }
    }

    write_vec_element(s, tcg_resl, rd, 0, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resl);
    write_vec_element(s, tcg_resh, rd, 1, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resh);
    clear_vec_high(s, true, rd);
}